

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O0

size_t __thiscall
adios2::utils::Reorganize::Decompose(Reorganize *this,int numproc,int rank,VarInfo *vi,int *np)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  ostream *poVar9;
  long *in_RCX;
  int in_EDX;
  long in_R8;
  size_t count;
  size_t start;
  string ints;
  size_t i;
  vector<int,_std::allocator<int>_> pos;
  int nps;
  size_t ndim;
  size_t i_1;
  size_t writesize;
  value_type *in_stack_fffffffffffffd98;
  allocator_type *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdc0;
  string *this_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe10;
  Reorganize *in_stack_fffffffffffffe18;
  string local_138 [32];
  string local_118 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<int,_std::allocator<int>_> *local_c8;
  long local_c0;
  string local_b8 [32];
  ulong local_98;
  vector<int,_std::allocator<int>_> local_78;
  int local_5c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  size_type local_40;
  ulong local_38;
  size_t local_30;
  long local_28;
  long *local_20;
  int local_18;
  size_t local_8;
  
  local_30 = 0;
  if (*in_RCX == 0) {
    local_8 = 0;
  }
  else if (*(int *)(*in_RCX + 0x40) == 5) {
    if (in_EDX == 0) {
      local_30 = 1;
      local_20 = in_RCX;
      for (local_38 = 0; uVar3 = local_38,
          sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (*local_20 + 0x88)), uVar3 < sVar5; local_38 = local_38 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (*local_20 + 0x88),local_38);
        local_30 = *pvVar6 * local_30;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*local_20 + 0x88),
                   local_38);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      }
    }
    else {
      local_30 = 0;
    }
    local_8 = local_30;
  }
  else {
    local_28 = in_R8;
    local_18 = in_EDX;
    adios2::core::VariableBase::Shape((ulong)&local_58);
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffda0);
    if (sVar5 == 0) {
      local_30 = (size_t)(local_18 == 0);
      local_8 = local_30;
    }
    else {
      local_5c = 1;
      local_40 = sVar5;
      std::allocator<int>::allocator((allocator<int> *)0x1242b9);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::allocator<int>::~allocator((allocator<int> *)0x1242e5);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      for (local_98 = 0; local_98 < local_40 - 1; local_98 = local_98 + 1) {
        lVar1 = (long)local_5c;
        lVar2 = (long)local_18;
        iVar4 = *(int *)(local_28 + local_98 * 4);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_98);
        *pvVar7 = (value_type)
                  ((long)((ulong)(uint)((int)(lVar2 / lVar1) >> 0x1f) << 0x20 |
                         lVar2 / lVar1 & 0xffffffffU) % (long)iVar4);
        local_5c = *(int *)(local_28 + local_98 * 4) * local_5c;
      }
      iVar4 = local_18 / local_5c;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_98);
      *pvVar7 = iVar4;
      VectorToString<std::vector<int,std::allocator<int>>>
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_40 - 1);
      if (*pvVar7 < *(int *)(local_28 + (local_40 - 1) * 4)) {
        poVar8 = std::operator<<((ostream *)&std::cout,"rank ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18);
        poVar8 = std::operator<<(poVar8,": position in ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40);
        poVar8 = std::operator<<(poVar8,"-D decomposition = ");
        in_stack_fffffffffffffe18 = (Reorganize *)std::operator<<(poVar8,local_b8);
        std::ostream::operator<<
                  ((ostream *)in_stack_fffffffffffffe18,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,"rank ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18);
        poVar8 = std::operator<<(poVar8,": position in ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40);
        poVar8 = std::operator<<(poVar8,"-D decomposition = ");
        poVar8 = std::operator<<(poVar8,local_b8);
        poVar8 = std::operator<<(poVar8," ---> Out of bound process");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      local_30 = 1;
      for (local_98 = 0; local_98 < local_40; local_98 = local_98 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_40 - 1);
        if (*pvVar7 < *(int *)(local_28 + (local_40 - 1) * 4)) {
          adios2::core::VariableBase::Shape((ulong)&local_e0);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_e0,local_98);
          local_c8 = (vector<int,_std::allocator<int>_> *)
                     (*pvVar6 / (ulong)(long)*(int *)(local_28 + local_98 * 4));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffda0);
          in_stack_fffffffffffffe10 = local_c8;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_98);
          local_c0 = (long)in_stack_fffffffffffffe10 * (long)*pvVar7;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_98);
          if (*pvVar7 == *(int *)(local_28 + local_98 * 4) + -1) {
            adios2::core::VariableBase::Shape((ulong)&local_f8);
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_f8,local_98);
            local_c8 = (vector<int,_std::allocator<int>_> *)
                       (*pvVar6 - (long)local_c8 * (long)(*(int *)(local_28 + local_98 * 4) + -1));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffda0);
          }
        }
        else {
          local_c8 = (vector<int,_std::allocator<int>_> *)0x0;
          local_c0 = 0;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        local_30 = (long)local_c8 * local_30;
      }
      VectorToString<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (in_stack_fffffffffffffe18,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10)
      ;
      std::__cxx11::string::operator=(local_b8,local_118);
      std::__cxx11::string::~string(local_118);
      poVar8 = std::operator<<((ostream *)&std::cout,"rank ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18);
      poVar8 = std::operator<<(poVar8,": ldims in ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40);
      poVar8 = std::operator<<(poVar8,"-D space = {");
      poVar8 = std::operator<<(poVar8,local_b8);
      poVar8 = std::operator<<(poVar8,"}");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      VectorToString<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (in_stack_fffffffffffffe18,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10)
      ;
      this_00 = local_138;
      std::__cxx11::string::operator=(local_b8,this_00);
      std::__cxx11::string::~string(this_00);
      poVar8 = std::operator<<((ostream *)&std::cout,"rank ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18);
      poVar8 = std::operator<<(poVar8,": offsets in ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40);
      poVar8 = std::operator<<(poVar8,"-D space = {");
      poVar9 = std::operator<<(poVar8,local_b8);
      poVar9 = std::operator<<(poVar9,"}");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      local_8 = local_30;
      std::__cxx11::string::~string(local_b8);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar8);
    }
  }
  return local_8;
}

Assistant:

size_t Reorganize::Decompose(int numproc, int rank, VarInfo &vi,
                             const int *np // number of processes in each dimension
)
{
    size_t writesize = 0;
    if (vi.v == nullptr)
    {
        return writesize;
    }

    /* Handle local array: only one block for now */
    if (vi.v->m_ShapeID == adios2::ShapeID::LocalArray)
    {
        if (rank == 0)
        {
            writesize = 1;
            for (size_t i = 0; i < vi.v->m_Count.size(); i++)
            {
                writesize *= vi.v->m_Count[i];
                // vi.start.push_back(0);
                vi.count.push_back(vi.v->m_Count[i]);
            }
        }
        else
        {
            writesize = 0;
        }
        return writesize;
    }

    size_t ndim = vi.v->Shape().size();

    /* Scalars */
    if (ndim == 0)
    {
        // scalars -> rank 0 writes them
        if (rank == 0)
            writesize = 1;
        else
            writesize = 0;
        return writesize;
    }

    /* Global Arrays */
    /* calculate this process' position in the n-dim space
    0 1 2
    3 4 5
    6 7 8

    for 1D:
    posx = rank/1             ! 1st dim: 0, 1, 2...,rank-1 are in the same X
    position

    for 2D:
    posx = mod(rank, npx)     ! 1st dim: 0, npx, 2npx... are in the same X
    position
    posy = rank/(npx)         ! 2nd dim: npx processes belong into one dim

    for 3D:
    posx = mod(rank, npx)     ! 1st dim: 0, npx, 2npx... are in the same X
    position
    posy = mod(rank/npx, npy) ! 2nd dim: (0, npx-1) have the same dim (so divide
    with npx first)
    posz = rank/(npx*npy)     ! 3rd dim: npx*npy processes belong into one dim
    */
    int nps = 1;
    std::vector<int> pos(ndim); // rank's position in each dimensions
    vi.start.reserve(ndim);
    vi.count.reserve(ndim);

    size_t i = 0;
    for (i = 0; i < ndim - 1; i++)
    {
        pos[i] = (rank / nps) % np[i];
        nps *= np[i];
    }
    pos[i] = rank / nps;

    std::string ints = VectorToString(pos);
    if (pos[ndim - 1] >= np[ndim - 1])
    {
        std::cout << "rank " << rank << ": position in " << ndim << "-D decomposition = " << ints
                  << " ---> Out of bound process" << std::endl;
    }
    else
    {
        std::cout << "rank " << rank << ": position in " << ndim << "-D decomposition = " << ints
                  << std::endl;
    }

    /* Decompose each dimension according to the position */
    writesize = 1;
    for (i = 0; i < ndim; i++)
    {
        size_t start, count;
        if (pos[ndim - 1] >= np[ndim - 1])
        {
            // this process gets nothing to read
            count = 0;
            start = 0;
        }
        else
        {
            count = vi.v->Shape()[i] / np[i];
            start = count * pos[i];
            if (pos[i] == np[i] - 1)
            {
                // last one in the dimension may need to read more than the rest
                count = vi.v->Shape()[i] - count * (np[i] - 1);
            }
        }
        vi.start.push_back(start);
        vi.count.push_back(count);
        writesize *= count;
    }
    ints = VectorToString(vi.count);
    std::cout << "rank " << rank << ": ldims in " << ndim << "-D space = {" << ints << "}"
              << std::endl;
    ints = VectorToString(vi.start);
    std::cout << "rank " << rank << ": offsets in " << ndim << "-D space = {" << ints << "}"
              << std::endl;
    return writesize;
}